

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O2

char * getoffset(char *strp,int_fast32_t *offsetp)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int local_1c;
  
  cVar1 = *strp;
  pcVar2 = getnum(strp + ((cVar1 - 0x2bU & 0xfd) == 0),&local_1c,0,0xa7);
  if (pcVar2 == (char *)0x0) {
LAB_0010651d:
    pcVar2 = (char *)0x0;
  }
  else {
    iVar3 = local_1c * 0xe10;
    *offsetp = iVar3;
    if (*pcVar2 == ':') {
      pcVar2 = getnum(pcVar2 + 1,&local_1c,0,0x3b);
      if (pcVar2 == (char *)0x0) goto LAB_0010651d;
      iVar3 = iVar3 + local_1c * 0x3c;
      *offsetp = iVar3;
      if (*pcVar2 == ':') {
        pcVar2 = getnum(pcVar2 + 1,&local_1c,0,0x3c);
        if (pcVar2 == (char *)0x0) goto LAB_0010651d;
        iVar3 = iVar3 + local_1c;
        *offsetp = iVar3;
      }
    }
    if (cVar1 == '-') {
      *offsetp = -iVar3;
    }
  }
  return pcVar2;
}

Assistant:

static const char * getoffset( const char * strp, int_fast32_t * offsetp )
{
    bool neg = false;

    if ( *strp == '-' )
    {
        neg = true;
        ++strp;
    }
    else if ( *strp == '+' )
    {
        ++strp;
    }

    strp = getsecs( strp, offsetp );

    if ( strp == NULL )
    {
        return NULL;        /* illegal time */
    }

    if ( neg )
    {
        *offsetp = - *offsetp;
    }

    return strp;
}